

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O0

size_t __thiscall GF2::ZZ<130UL>::Log(ZZ<130UL> *this)

{
  bool bVar1;
  WW<130UL> *in_RDI;
  size_t k;
  size_t local_18;
  
  local_18 = 0x82;
  while ((local_18 != 0 && (bVar1 = WW<130UL>::Test(in_RDI,local_18 - 1), !bVar1))) {
    local_18 = local_18 - 1;
  }
  return local_18;
}

Assistant:

size_t Log() const
	{
		size_t k = _n;
		while (k)
            if (Test(k - 1)) 
				return k;
			else 
				--k;
		return k;		
	}